

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend-reg.cpp
# Opt level: O0

void __thiscall
ggml_backend_registry::unload_backend
          (ggml_backend_registry *this,ggml_backend_reg_t reg,bool silent)

{
  bool bVar1;
  undefined8 uVar2;
  __normal_iterator<const_ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
  *this_00;
  iterator __first;
  byte in_DL;
  undefined8 in_RSI;
  long in_RDI;
  __normal_iterator<ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
  it;
  vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *in_stack_ffffffffffffff58;
  __normal_iterator<ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
  *in_stack_ffffffffffffff60;
  vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_> *in_stack_ffffffffffffff70
  ;
  const_iterator in_stack_ffffffffffffff78;
  __normal_iterator<ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
  in_stack_ffffffffffffff80;
  __normal_iterator<ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
  in_stack_ffffffffffffff88;
  
  std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::begin
            ((vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_> *)
             in_stack_ffffffffffffff58);
  std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::end
            ((vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_> *)
             in_stack_ffffffffffffff58);
  std::
  find_if<__gnu_cxx::__normal_iterator<ggml_backend_reg_entry*,std::vector<ggml_backend_reg_entry,std::allocator<ggml_backend_reg_entry>>>,ggml_backend_registry::unload_backend(ggml_backend_reg*,bool)::_lambda(ggml_backend_reg_entry_const&)_1_>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (anon_class_8_1_ba1d73f4_for__M_pred)in_stack_ffffffffffffff78._M_current);
  std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::end
            ((vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_> *)
             in_stack_ffffffffffffff58);
  bVar1 = __gnu_cxx::operator==
                    (in_stack_ffffffffffffff60,
                     (__normal_iterator<ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
                      *)in_stack_ffffffffffffff58);
  if (bVar1) {
    if ((in_DL & 1) == 0) {
      ggml_log_internal(4,"%s: backend not found\n","unload_backend");
    }
  }
  else {
    if ((in_DL & 1) == 0) {
      uVar2 = ggml_backend_reg_name(in_RSI);
      ggml_log_internal(1,"%s: unloading %s backend\n","unload_backend",uVar2);
    }
    this_00 = (__normal_iterator<const_ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
               *)(in_RDI + 0x18);
    std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::begin
              (in_stack_ffffffffffffff58);
    std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::end
              (in_stack_ffffffffffffff58);
    std::
    remove_if<__gnu_cxx::__normal_iterator<ggml_backend_device**,std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>>,ggml_backend_registry::unload_backend(ggml_backend_reg*,bool)::_lambda(ggml_backend_device*)_1_>
              ((__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                )in_stack_ffffffffffffff88._M_current,
               (__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                )in_stack_ffffffffffffff80._M_current,
               (anon_class_8_1_ba1d73f4_for__M_pred)in_stack_ffffffffffffff78._M_current);
    __gnu_cxx::
    __normal_iterator<ggml_backend_device*const*,std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>>
    ::__normal_iterator<ggml_backend_device**>
              ((__normal_iterator<ggml_backend_device_*const_*,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                *)this_00,
               (__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                *)in_stack_ffffffffffffff58);
    __first = std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::end
                        (in_stack_ffffffffffffff58);
    __gnu_cxx::
    __normal_iterator<ggml_backend_device*const*,std::vector<ggml_backend_device*,std::allocator<ggml_backend_device*>>>
    ::__normal_iterator<ggml_backend_device**>
              ((__normal_iterator<ggml_backend_device_*const_*,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                *)this_00,
               (__normal_iterator<ggml_backend_device_**,_std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>_>
                *)in_stack_ffffffffffffff58);
    std::vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_>::erase
              ((vector<ggml_backend_device_*,_std::allocator<ggml_backend_device_*>_> *)
               in_stack_ffffffffffffff78._M_current,(const_iterator)__first._M_current,
               (const_iterator)in_stack_ffffffffffffff80._M_current);
    __gnu_cxx::
    __normal_iterator<ggml_backend_reg_entry_const*,std::vector<ggml_backend_reg_entry,std::allocator<ggml_backend_reg_entry>>>
    ::__normal_iterator<ggml_backend_reg_entry*>
              (this_00,(__normal_iterator<ggml_backend_reg_entry_*,_std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>_>
                        *)in_stack_ffffffffffffff58);
    std::vector<ggml_backend_reg_entry,_std::allocator<ggml_backend_reg_entry>_>::erase
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  }
  return;
}

Assistant:

void unload_backend(ggml_backend_reg_t reg, bool silent) {
        auto it = std::find_if(backends.begin(), backends.end(),
                               [reg](const ggml_backend_reg_entry & entry) { return entry.reg == reg; });

        if (it == backends.end()) {
            if (!silent) {
                GGML_LOG_ERROR("%s: backend not found\n", __func__);
            }
            return;
        }

        if (!silent) {
            GGML_LOG_DEBUG("%s: unloading %s backend\n", __func__, ggml_backend_reg_name(reg));
        }

        // remove devices
        devices.erase(
            std::remove_if(devices.begin(), devices.end(),
                            [reg](ggml_backend_dev_t dev) { return ggml_backend_dev_backend_reg(dev) == reg; }),
            devices.end());

        // remove backend
        backends.erase(it);
    }